

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void write_string(StringArray *string_array,char *string,size_t length)

{
  String *pSVar1;
  uint32_t local_24;
  size_t length_local;
  char *string_local;
  StringArray *string_array_local;
  
  if (string_array->cap <= string_array->count) {
    if (string_array->cap < 8) {
      local_24 = 8;
    }
    else {
      local_24 = string_array->cap << 1;
    }
    string_array->cap = local_24;
    pSVar1 = (String *)reallocate(string_array->strings,(ulong)string_array->cap << 4);
    string_array->strings = pSVar1;
  }
  string_array->strings[string_array->count].start = string;
  string_array->strings[string_array->count].length = length;
  string_array->count = string_array->count + 1;
  return;
}

Assistant:

static void write_string(StringArray *string_array, char *string, size_t length) {
    if (string_array->count >= string_array->cap) {
        string_array->cap = GROW_CAP(string_array->cap);
        string_array->strings = GROW_ARR(string_array->strings, String, string_array->cap);
    }

    string_array->strings[string_array->count].start = string;
    string_array->strings[string_array->count].length = length;
    ++string_array->count;
}